

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_function_impl.h
# Opt level: O3

void __thiscall
dlib::any_function<void_(),_void,_0UL>::derived<dlib::impl::image_display_functor,_void_()>::derived
          (derived<dlib::impl::image_display_functor,_void_()> *this,image_display_functor *val)

{
  pointer pcVar1;
  
  (this->super_base)._vptr_Tbase = (_func_int **)&PTR__derived_00316ff8;
  (this->item).str._M_dataplus._M_p = (pointer)&(this->item).str.field_2;
  pcVar1 = (val->str)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->item,pcVar1,pcVar1 + (val->str)._M_string_length);
  (this->item).mfp.super_mfp_kernel_1_base_class<1UL>.mp_memory.data = &(this->item).mfp;
  (**(code **)(*(val->mfp).super_mfp_kernel_1_base_class<1UL>.mp_memory.data + 0x10))();
  return;
}

Assistant:

DLIB_ANY_FUNCTION_DERIVED_BOILERPLATE

    virtual result_type evaluate (
    ) const { DLIB_ANY_FUNCTION_RETURN item(); }